

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  stbtt__buf fontdict;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  stbtt_uint32 sVar16;
  long lVar17;
  int *piVar18;
  undefined1 uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uchar *puVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  float fVar39;
  float dy1;
  float fVar40;
  float dy2;
  float fVar41;
  float dx3;
  float fVar42;
  float fVar43;
  stbtt__buf sVar44;
  stbtt__buf b;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined8 in_stack_fffffffffffffdb8;
  ulong local_230;
  uchar *puVar45;
  undefined1 auStack_1e0 [8];
  undefined8 local_1d8;
  float fStack_1d0;
  int local_1cc;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar45 = (info->subrs).data;
  local_108.cursor = (info->subrs).cursor;
  local_108.size = (info->subrs).size;
  sVar44 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar38 = sVar44._8_8_;
  local_258 = sVar44.data._0_4_;
  uStack_254 = sVar44.data._4_4_;
  iVar33 = sVar44.size;
  if (iVar33 <= sVar44.cursor) {
switchD_0015a7ba_default:
    return 0;
  }
  local_108.data = puVar45;
  lVar24 = (long)glyph_index + 1;
  local_e0 = &(info->gsubrs).cursor;
  bVar12 = true;
  puVar45 = (uchar *)0x0;
  local_230 = 0;
  bVar13 = false;
  uVar36 = 0;
  local_1d8 = lVar24;
  local_1cc = glyph_index;
LAB_0015a3f3:
  fVar39 = s[0xb];
  dy2 = s[9];
  fVar15 = s[8];
  dy1 = s[7];
  dx3 = s[6];
  fVar43 = s[5];
  fVar42 = s[4];
  fVar41 = s[3];
  fVar40 = s[2];
  uVar20 = (uint)uVar38;
  uVar25 = uVar20 + 1;
  bVar11 = *(byte *)(CONCAT44(uStack_254,local_258) + (long)(int)uVar20);
  uVar35 = (uint)uVar36;
  iVar26 = (int)local_230;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    puVar45 = (uchar *)(ulong)(uint)((int)puVar45 + ((int)((int)(uVar36 >> 0x1f) + uVar35) >> 1));
    goto LAB_0015b04a;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_0015a423_caseD_2:
    if (bVar11 < 0x20) {
      return 0;
    }
    if (bVar11 == 0xff) goto LAB_0015a53e;
  case 0x1c:
    if (((int)uVar25 < 1) || (iVar33 < (int)uVar20)) {
LAB_0015b085:
      __assert_fail("!(o > b->size || o < 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                    ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
    }
    sVar16 = stbtt__cff_int((stbtt__buf *)&local_258);
    fVar39 = (float)(int)(short)sVar16;
    uVar25 = uVar20;
LAB_0015a57d:
    if (0x2f < (int)uVar35) {
      return 0;
    }
    s[(int)uVar35] = fVar39;
    uVar37 = (ulong)(uVar35 + 1);
    break;
  case 4:
    if ((int)uVar35 < 1) {
      return 0;
    }
    fVar39 = s[uVar35 - 1];
    fVar40 = 0.0;
    goto LAB_0015aa97;
  case 5:
    if ((int)uVar35 < 2) {
      return 0;
    }
    uVar38 = 1;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar39 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar38 - 1));
      fVar40 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar38 - 1)) >> 0x20);
      c->x = fVar39;
      c->y = fVar40;
      uVar37 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar39,(int)fVar40,0,0,0,0);
      uVar38 = uVar38 + 2;
    } while (uVar38 < uVar36);
    break;
  case 6:
    iVar26 = 0;
    if ((int)uVar35 < 1) {
      return 0;
    }
    for (; iVar26 < (int)uVar35; iVar26 = iVar26 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar39 = s[iVar26];
      c->x = fVar39 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar39 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar26 = iVar26 + 1;
LAB_0015aff2:
      if ((int)uVar35 <= iVar26) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar39 = s[iVar26];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar39 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar39 + (float)uVar10),0,0,0,0);
    }
    goto LAB_0015b04a;
  case 7:
    iVar26 = 0;
    if (0 < (int)uVar35) goto LAB_0015aff2;
    return 0;
  case 8:
    if ((int)uVar35 < 6) {
      return 0;
    }
    uVar38 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,*(float *)(auStack_1e0 + uVar38 * 4 + 4),
                 *(float *)((long)&local_1d8 + uVar38 * 4),
                 *(float *)((long)&local_1d8 + uVar38 * 4 + 4),(&fStack_1d0)[uVar38],s[uVar38 - 1],
                 s[uVar38]);
      uVar38 = uVar38 + 6;
    } while (uVar38 < uVar36);
    goto LAB_0015b04a;
  case 10:
    bVar14 = true;
    if (!bVar13) {
      uVar20 = (info->fdselect).size;
      if (uVar20 != 0) {
        if ((int)uVar20 < 0) goto LAB_0015b085;
        puVar29 = (info->fdselect).data;
        if (*puVar29 == '\0') {
          if (uVar20 < (uint)lVar24) goto LAB_0015b085;
          uVar22 = 0;
          if ((int)(uint)lVar24 < (int)uVar20) {
            uVar22 = (uint)puVar29[lVar24];
          }
        }
        else {
          if (*puVar29 == '\x03') {
            uVar27 = 0;
            iVar28 = 1;
            iVar21 = 2;
            do {
              if (iVar28 < (int)uVar20) {
                lVar31 = (long)iVar28;
                iVar28 = iVar28 + 1;
                uVar22 = (uint)puVar29[lVar31];
              }
              else {
                uVar22 = 0;
              }
              uVar27 = uVar27 << 8 | uVar22;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
            uVar30 = 0;
            iVar21 = 2;
            do {
              if (iVar28 < (int)uVar20) {
                lVar31 = (long)iVar28;
                iVar28 = iVar28 + 1;
                uVar22 = (uint)puVar29[lVar31];
              }
              else {
                uVar22 = 0;
              }
              uVar30 = uVar30 << 8 | uVar22;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
            if (0 < (int)uVar27) {
              uVar32 = 0;
              do {
                if (iVar28 < (int)uVar20) {
                  lVar24 = (long)iVar28;
                  iVar28 = iVar28 + 1;
                  uVar22 = (uint)puVar29[lVar24];
                }
                else {
                  uVar22 = 0;
                }
                uVar34 = 0;
                iVar21 = 2;
                do {
                  if (iVar28 < (int)uVar20) {
                    lVar24 = (long)iVar28;
                    iVar28 = iVar28 + 1;
                    uVar23 = (uint)puVar29[lVar24];
                  }
                  else {
                    uVar23 = 0;
                  }
                  uVar34 = uVar34 << 8 | uVar23;
                  iVar21 = iVar21 + -1;
                } while (iVar21 != 0);
                lVar24 = local_1d8;
                if (local_1cc < (int)uVar34 && (int)uVar30 <= local_1cc) goto LAB_0015ad74;
                uVar32 = uVar32 + 1;
                uVar30 = uVar34;
              } while (uVar32 != uVar27);
            }
          }
          uVar22 = 0xffffffff;
        }
LAB_0015ad74:
        stbtt__cff_index_get(info->fontdicts,uVar22);
        sVar44.data._4_4_ = iVar33;
        sVar44.data._0_4_ = uVar25;
        sVar44.cursor = (int)in_stack_fffffffffffffdb8;
        sVar44.size = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
        fontdict._8_8_ = info;
        fontdict.data = puVar45;
        local_108 = stbtt__get_subrs(sVar44,fontdict);
        bVar14 = true;
      }
    }
    goto LAB_0015adc2;
  case 0xb:
    if (iVar26 < 1) {
      return 0;
    }
    local_230 = (ulong)(iVar26 - 1);
    local_258 = *(undefined4 *)&subr_stack[local_230].data;
    uStack_254 = *(undefined4 *)((long)&subr_stack[local_230].data + 4);
    uVar25 = subr_stack[local_230].cursor;
    iVar33 = subr_stack[local_230].size;
    uVar37 = uVar36;
    break;
  case 0xc:
    lVar31 = (long)(int)uVar25;
    uVar19 = 0;
    if ((int)uVar25 < iVar33) {
      uVar25 = uVar20 + 2;
      uVar19 = *(undefined1 *)(CONCAT44(uStack_254,local_258) + lVar31);
    }
    switch(uVar19) {
    case 0x22:
      if ((int)uVar35 < 7) {
        return 0;
      }
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar40;
      dy1 = 0.0;
      fVar39 = 0.0;
      break;
    case 0x23:
      if ((int)uVar35 < 0xd) {
        return 0;
      }
      local_f8 = s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar42 = dx3;
      fVar43 = fVar15;
      dx3 = local_f8;
      break;
    case 0x24:
      if ((int)uVar35 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar39 = -(local_f8 + fVar41 + dy1);
      fVar42 = fVar43;
      dy2 = dy1;
      fVar43 = dx3;
      dy1 = 0.0;
      dx3 = fVar15;
      break;
    case 0x25:
      if ((int)uVar35 < 0xb) {
        return 0;
      }
      auStack_1e0 = (undefined1  [8])0x0;
      fVar39 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar41 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar42 = ABS(fVar39);
      fVar43 = ABS(fVar41);
      fVar40 = s[10];
      if (fVar42 <= fVar43) {
        fVar40 = -fVar39;
      }
      uVar20 = -(uint)(fVar43 < fVar42);
      fVar39 = (float)(~uVar20 & (uint)s[10] | (uint)-fVar41 & uVar20);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar42 = dx3;
      fVar43 = fVar15;
      dx3 = fVar40;
      break;
    default:
      goto switchD_0015a7ba_default;
    }
    goto LAB_0015a763;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar12) {
      puVar45 = (uchar *)(ulong)(uint)((int)puVar45 + ((int)((int)(uVar36 >> 0x1f) + uVar35) >> 1));
    }
    iVar21 = (int)puVar45 + 7;
    iVar26 = (int)puVar45 + 0xe;
    if (-1 < iVar21) {
      iVar26 = iVar21;
    }
    uVar25 = (iVar26 >> 3) + uVar25;
    if (((int)uVar25 < 0) || (iVar33 < (int)uVar25)) goto LAB_0015b085;
    goto LAB_0015aacf;
  case 0x15:
    if ((int)uVar35 < 2) {
      return 0;
    }
    fVar40 = s[uVar35 - 2];
    fVar39 = s[uVar35 - 1];
    goto LAB_0015aa97;
  case 0x16:
    if ((int)uVar35 < 1) {
      return 0;
    }
    fVar40 = s[uVar35 - 1];
    fVar39 = 0.0;
LAB_0015aa97:
    stbtt__csctx_rmove_to(c,fVar40,fVar39);
LAB_0015aacf:
    bVar12 = false;
    uVar37 = 0;
    break;
  case 0x18:
    if ((int)uVar35 < 8) {
      return 0;
    }
    lVar31 = -6;
    do {
      lVar17 = lVar31;
      stbtt__csctx_rccurve_to
                (c,s[lVar17 + 6],s[lVar17 + 7],s[lVar17 + 8],s[lVar17 + 9],s[lVar17 + 10],
                 s[lVar17 + 0xb]);
      lVar24 = local_1d8;
      lVar31 = lVar17 + 6;
    } while (lVar17 + 6 < (long)(int)uVar35 + -0xd);
    if ((int)uVar35 <= (int)lVar17 + 0xd) {
      return 0;
    }
    uVar3 = c->x;
    uVar8 = c->y;
    fVar39 = (float)uVar3 + (float)*(undefined8 *)(s + lVar17 + 0xc);
    fVar40 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + lVar17 + 0xc) >> 0x20);
    c->x = fVar39;
    c->y = fVar40;
    stbtt__csctx_v(c,'\x02',(int)fVar39,(int)fVar40,0,0,0,0);
    uVar37 = 0;
    break;
  case 0x19:
    if ((int)uVar35 < 8) {
      return 0;
    }
    lVar31 = 5;
    do {
      lVar17 = lVar31;
      uVar1 = c->x;
      uVar6 = c->y;
      fVar39 = (float)uVar1 + (float)*(undefined8 *)(auStack_1e0 + lVar17 * 4 + 4);
      fVar40 = (float)uVar6 + (float)((ulong)*(undefined8 *)(auStack_1e0 + lVar17 * 4 + 4) >> 0x20);
      c->x = fVar39;
      c->y = fVar40;
      stbtt__csctx_v(c,'\x02',(int)fVar39,(int)fVar40,0,0,0,0);
      lVar31 = lVar17 + 2;
    } while (lVar17 + -2 < (long)(int)(uVar35 - 6));
    if ((int)uVar35 <= (int)lVar31) {
      return 0;
    }
    fVar39 = s[lVar31];
    lVar24 = local_1d8;
    fVar42 = *(float *)(auStack_1e0 + lVar31 * 4 + 4);
    dy2 = (&fStack_1d0)[lVar31];
    fVar43 = *(float *)((long)&local_1d8 + lVar31 * 4 + 4);
    dy1 = *(float *)((long)&local_1d8 + lVar31 * 4);
    dx3 = s[lVar17 + 1];
LAB_0015a763:
    stbtt__csctx_rccurve_to(c,fVar42,dy1,fVar43,dy2,dx3,fVar39);
    goto LAB_0015b04a;
  case 0x1a:
  case 0x1b:
    if ((int)uVar35 < 4) {
      return 0;
    }
    uVar38 = (ulong)(uVar35 & 1);
    if ((int)((uVar35 & 1) + 3) < (int)uVar35) {
      fVar39 = 0.0;
      if ((uVar36 & 1) != 0) {
        fVar39 = s[0];
      }
      do {
        iVar26 = (int)uVar38;
        fVar40 = s[uVar38];
        if (bVar11 == 0x1b) {
          fVar42 = fVar40;
          fVar43 = 0.0;
          fVar41 = s[iVar26 + 3];
          fVar40 = fVar39;
        }
        else {
          fVar41 = 0.0;
          fVar42 = fVar39;
          fVar43 = s[iVar26 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar42,fVar40,s[uVar38 + 1],s[uVar38 + 2],fVar41,fVar43);
        uVar38 = uVar38 + 4;
        fVar39 = 0.0;
      } while (iVar26 + 7 < (int)uVar35);
    }
    goto LAB_0015b04a;
  case 0x1d:
    bVar14 = bVar13;
LAB_0015adc2:
    if ((int)uVar35 < 1) {
      return 0;
    }
    if (9 < iVar26) {
      return 0;
    }
    fVar39 = s[uVar35 - 1];
    *(undefined4 *)&subr_stack[iVar26].data = local_258;
    *(undefined4 *)((long)&subr_stack[iVar26].data + 4) = uStack_254;
    subr_stack[iVar26].cursor = uVar25;
    subr_stack[iVar26].size = iVar33;
    piVar18 = &local_108.cursor;
    puVar29 = local_108.data;
    if (bVar11 != 10) {
      puVar29 = (info->gsubrs).data;
      piVar18 = local_e0;
    }
    uVar38 = *(ulong *)piVar18;
    if ((long)uVar38 < 0) goto LAB_0015b085;
    local_230 = (ulong)(iVar26 + 1);
    uVar25 = 0;
    iVar33 = 2;
    uVar20 = 0;
    do {
      if ((int)uVar25 < (int)(uVar38 >> 0x20)) {
        lVar31 = (long)(int)uVar25;
        uVar25 = uVar25 + 1;
        uVar22 = (uint)puVar29[lVar31];
      }
      else {
        uVar22 = 0;
      }
      uVar20 = uVar20 << 8 | uVar22;
      iVar33 = iVar33 + -1;
    } while (iVar33 != 0);
    uVar22 = (uint)(0x4d7 < (int)uVar20) << 10 | 0x6b;
    if (0x846b < (int)uVar20) {
      uVar22 = 0x8000;
    }
    iVar33 = uVar22 + (int)fVar39;
    sVar44 = (stbtt__buf)ZEXT816(0);
    if (iVar33 < (int)uVar20 && -1 < iVar33) {
      b._8_8_ = (ulong)uVar25 | uVar38 & 0x7fffffff00000000;
      b.data = puVar29;
      sVar44 = stbtt__cff_index_get(b,iVar33);
    }
    local_258 = sVar44.data._0_4_;
    uStack_254 = sVar44.data._4_4_;
    iVar33 = sVar44.size;
    if (iVar33 == 0) {
      return 0;
    }
    uVar25 = 0;
    uVar37 = (ulong)(uVar35 - 1);
    bVar13 = bVar14;
    break;
  case 0x1e:
    iVar26 = 0;
    if ((int)uVar35 < 4) {
      return 0;
    }
    for (; iVar26 + 3 < (int)uVar35; iVar26 = iVar26 + 4) {
      fVar39 = 0.0;
      if (uVar35 - iVar26 == 5) {
        fVar39 = s[(long)iVar26 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar26],s[(long)iVar26 + 1],s[(long)iVar26 + 2],s[iVar26 + 3],fVar39);
      iVar26 = iVar26 + 4;
LAB_0015af46:
      if ((int)uVar35 <= iVar26 + 3) break;
      fVar39 = 0.0;
      if (uVar35 - iVar26 == 5) {
        fVar39 = s[(long)iVar26 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar26],0.0,s[(long)iVar26 + 1],s[(long)iVar26 + 2],fVar39,s[iVar26 + 3]);
    }
LAB_0015b04a:
    uVar37 = 0;
    break;
  case 0x1f:
    iVar26 = 0;
    if (3 < (int)uVar35) goto LAB_0015af46;
    return 0;
  default:
    if (bVar11 != 0xff) goto switchD_0015a423_caseD_2;
LAB_0015a53e:
    uVar20 = 0;
    iVar26 = 4;
    do {
      if ((int)uVar25 < iVar33) {
        lVar31 = (long)(int)uVar25;
        uVar25 = uVar25 + 1;
        uVar22 = (uint)*(byte *)(CONCAT44(uStack_254,local_258) + lVar31);
      }
      else {
        uVar22 = 0;
      }
      uVar20 = uVar20 << 8 | uVar22;
      iVar26 = iVar26 + -1;
    } while (iVar26 != 0);
    fVar39 = (float)(int)uVar20 * 1.5258789e-05;
    goto LAB_0015a57d;
  }
  uVar38 = (ulong)uVar25;
  uVar36 = uVar37;
  if (iVar33 <= (int)uVar25) {
    return 0;
  }
  goto LAB_0015a3f3;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254)) //-V560
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}